

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

void vdebug(char *msg,__va_list_tag *ap)

{
  string buf;
  string local_28;
  
  vdebugmsg_abi_cxx11_(&local_28,msg,ap);
  debugoutput(local_28._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void vdebug(const char *msg, va_list ap)
{
    std::string buf= vdebugmsg(msg, ap);
#ifdef WIN32
    if (g_debugOutputFlags&DBG_WCHAROUTPUT) {
        wdebugoutput(ToWString(buf).c_str());
    }
#endif
    debugoutput(buf.c_str());
}